

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_set_compression_deflate(archive *_a)

{
  int iVar1;
  zip_conflict *zip;
  int magic_test;
  int ret;
  archive_write *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,7,"archive_write_zip_set_compression_deflate");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    if (_a->archive_format == 0x50000) {
      *(undefined4 *)(*(long *)&_a[1].current_codepage + 200) = 8;
      zip._4_4_ = 0;
    }
    else {
      archive_set_error(_a,-1,
                        "Can only use archive_write_zip_set_compression_deflate with zip format");
      zip._4_4_ = -0x1e;
    }
    _a_local._4_4_ = zip._4_4_;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_zip_set_compression_deflate(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	int ret = ARCHIVE_FAILED;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
		ARCHIVE_STATE_NEW | ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
		"archive_write_zip_set_compression_deflate");
	if (a->archive.archive_format != ARCHIVE_FORMAT_ZIP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		"Can only use archive_write_zip_set_compression_deflate"
		" with zip format");
		ret = ARCHIVE_FATAL;
	} else {
#ifdef HAVE_ZLIB_H
		struct zip *zip = a->format_data;
		zip->requested_compression = COMPRESSION_DEFLATE;
		ret = ARCHIVE_OK;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"deflate compression not supported");
		ret = ARCHIVE_FAILED;
#endif
	}
	return (ret);
}